

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

static_huffman_data_model * __thiscall
crnd::static_huffman_data_model::operator=
          (static_huffman_data_model *this,static_huffman_data_model *rhs)

{
  vector<unsigned_char> *this_00;
  decoder_tables *other;
  bool bVar1;
  decoder_tables *pdVar2;
  uint32 min_new_capacity;
  
  if (this == rhs) {
    return this;
  }
  this->m_total_syms = rhs->m_total_syms;
  min_new_capacity = (rhs->m_code_sizes).m_size;
  if ((this->m_code_sizes).m_capacity == min_new_capacity) {
    if ((this->m_code_sizes).m_size != 0) {
      (this->m_code_sizes).m_size = 0;
    }
  }
  else {
    this_00 = &this->m_code_sizes;
    if (this_00->m_p != (uchar *)0x0) {
      crnd_free(this_00->m_p);
      this_00->m_p = (uchar *)0x0;
      (this->m_code_sizes).m_size = 0;
      (this->m_code_sizes).m_capacity = 0;
      min_new_capacity = (rhs->m_code_sizes).m_size;
    }
    (this->m_code_sizes).m_alloc_failed = false;
    bVar1 = elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,min_new_capacity,false,1,(object_mover)0x0);
    if (!bVar1) {
      (this->m_code_sizes).m_alloc_failed = true;
      goto LAB_00111dcc;
    }
  }
  memcpy((this->m_code_sizes).m_p,(rhs->m_code_sizes).m_p,(ulong)(rhs->m_code_sizes).m_size);
  (this->m_code_sizes).m_size = (rhs->m_code_sizes).m_size;
  if (((this->m_code_sizes).m_alloc_failed & 1U) == 0) {
    other = rhs->m_pDecode_tables;
    pdVar2 = this->m_pDecode_tables;
    if (other == (decoder_tables *)0x0) {
      if (pdVar2 != (decoder_tables *)0x0) {
        if (pdVar2->m_lookup != (uint32 *)0x0) {
          crnd_free(pdVar2->m_lookup + -2);
        }
        if (pdVar2->m_sorted_symbol_order != (uint16 *)0x0) {
          crnd_free(pdVar2->m_sorted_symbol_order + -4);
        }
        crnd_free(pdVar2);
      }
      this->m_pDecode_tables = (decoder_tables *)0x0;
      return this;
    }
    if (pdVar2 != (decoder_tables *)0x0) {
      prefix_coding::decoder_tables::operator=(pdVar2,other);
      return this;
    }
    pdVar2 = (decoder_tables *)crnd_malloc(0xc0,(size_t *)0x0);
    if (pdVar2 != (decoder_tables *)0x0) {
      pdVar2->m_sorted_symbol_order = (uint16 *)0x0;
      *(undefined8 *)&pdVar2->m_cur_lookup_size = 0;
      *(undefined8 *)((long)&pdVar2->m_lookup + 4) = 0;
      prefix_coding::decoder_tables::operator=(pdVar2,other);
    }
    this->m_pDecode_tables = pdVar2;
    return this;
  }
LAB_00111dcc:
  clear(this);
  return this;
}

Assistant:

static_huffman_data_model& static_huffman_data_model::operator=(const static_huffman_data_model& rhs)
    {
        if (this == &rhs)
            return *this;

        m_total_syms = rhs.m_total_syms;
        m_code_sizes = rhs.m_code_sizes;
        if (m_code_sizes.get_alloc_failed())
        {
            clear();
            return *this;
        }

        if (rhs.m_pDecode_tables)
        {
            if (m_pDecode_tables)
                *m_pDecode_tables = *rhs.m_pDecode_tables;
            else
                m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
        }
        else
        {
            crnd_delete(m_pDecode_tables);
            m_pDecode_tables = NULL;
        }

        return *this;
    }